

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O1

void setup_runtime(void)

{
  char *pcVar1;
  char *b;
  long lVar2;
  char cwd [4096];
  char acStack_1018 [4104];
  
  pcVar1 = getenv("APPDIR_LIBC_LINKER_PATH");
  pcVar1 = strdup(pcVar1);
  pcVar1 = strtok(pcVar1,":");
  if (pcVar1 != (char *)0x0) {
    pcVar1 = (char *)gnu_get_libc_version();
    b = getenv("APPDIR_LIBC_VERSION");
    lVar2 = compare_version_strings(pcVar1,b);
    if (lVar2 < 1) {
      pcVar1 = resolve_runtime_path("runtime/compat");
      configure_embed_libc();
    }
    else {
      pcVar1 = resolve_runtime_path("runtime/default");
      configure_system_libc();
    }
    apprun_env_set("LD_PRELOAD","libapprun_hooks.so","","libapprun_hooks.so");
    apprun_env_set("APPRUN_RUNTIME",pcVar1,"",pcVar1);
    getcwd(acStack_1018,0x1000);
    setenv("APPRUN_CWD",acStack_1018,1);
    chdir(pcVar1);
  }
  return;
}

Assistant:

void setup_runtime() {
    char *linkers = strdup(getenv(APPDIR_LIBC_LINKER_PATH_ENV));
    char *ld_relpath = strtok(linkers, APPDIR_LIBC_LINKER_PATH_ENV_SEPARATOR);
    if (ld_relpath != NULL) {
        const char *system_ld_version = gnu_get_libc_version();
        const char *appdir_ld_version = getenv(APPDIR_LIBC_VERSION_ENV);

#ifdef DEBUG
        fprintf(stderr, "APPRUN_DEBUG: interpreter \"%s\" \n", ld_relpath);
        fprintf(stderr, "APPRUN_DEBUG: system ld(%s), appdir ld(%s) \n", system_ld_version, appdir_ld_version);
#endif
        char *runtime_path = NULL;
        if (compare_version_strings(system_ld_version, appdir_ld_version) > 0) {
            runtime_path = resolve_runtime_path("runtime/default");
            configure_system_libc();
        } else {
            runtime_path = resolve_runtime_path("runtime/compat");
            configure_embed_libc();
        }

        apprun_env_set("LD_PRELOAD", "libapprun_hooks.so", "", "libapprun_hooks.so");
        apprun_env_set(APPRUN_ENV_RUNTIME, runtime_path, "", runtime_path);

        char cwd[PATH_MAX];
        getcwd(cwd, PATH_MAX);
        setenv(APPRUN_ENV_ORIGINAL_WORKDIR, cwd, 1);
        chdir(runtime_path);
    }
}